

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::int_writer<char,_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<char,_fmt::v6::basic_format_specs<char>_> *this)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  num_writer f;
  char cVar4;
  int iVar5;
  int iVar6;
  _Alloc_hider _Var7;
  uint uVar8;
  int iVar9;
  int num_digits;
  string_view prefix;
  string groups;
  undefined7 uStack_3f;
  string local_38;
  
  grouping_impl<char>(&local_38,(locale_ref)(this->writer->locale_).locale_);
  if (local_38._M_string_length == 0) {
    on_dec(this);
    goto LAB_0014ab64;
  }
  cVar4 = thousands_sep_impl<char>((locale_ref)(this->writer->locale_).locale_);
  if (cVar4 == '\0') {
    on_dec(this);
    goto LAB_0014ab64;
  }
  uVar3 = this->abs_value;
  uVar8 = 0x1f;
  if ((uVar3 | 1) != 0) {
    for (; (uVar3 | 1) >> uVar8 == 0; uVar8 = uVar8 - 1) {
    }
  }
  uVar8 = (uVar8 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  iVar9 = (uVar8 + 1) -
          (uint)(uVar3 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32 + (ulong)uVar8 * 4));
  pcVar1 = local_38._M_dataplus._M_p + local_38._M_string_length;
  _Var7._M_p = local_38._M_dataplus._M_p;
  iVar5 = iVar9;
  if (local_38._M_string_length == 0) {
LAB_0014ab0c:
    num_digits = iVar9;
    iVar6 = iVar5;
    if (_Var7._M_p == pcVar1) goto LAB_0014ab16;
  }
  else {
    num_digits = iVar9 + (int)local_38._M_string_length;
    do {
      cVar2 = *_Var7._M_p;
      iVar6 = iVar5 - cVar2;
      if ((iVar6 == 0 || iVar5 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) goto LAB_0014ab0c;
      iVar9 = iVar9 + 1;
      _Var7._M_p = _Var7._M_p + 1;
      local_38._M_string_length = local_38._M_string_length - 1;
      iVar5 = iVar6;
    } while (local_38._M_string_length != 0);
LAB_0014ab16:
    num_digits = (iVar6 + -1) / (int)pcVar1[-1] + num_digits;
  }
  f._17_7_ = uStack_3f;
  f.sep = cVar4;
  f.size = num_digits;
  f.abs_value = uVar3;
  f.groups = &local_38;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
  ::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<char,fmt::v6::basic_format_specs<char>>::num_writer>
            ((basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
              *)this->writer,num_digits,prefix,*this->specs,f);
LAB_0014ab64:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }